

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O2

error_code __thiscall simdjson::dom::parser::allocate(parser *this,size_t capacity,size_t max_depth)

{
  dom_parser_implementation *this_00;
  error_code eVar1;
  
  this_00 = (this->implementation)._M_t.
            super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
            ._M_t.
            super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
            .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
            _M_head_impl;
  if (this_00 != (dom_parser_implementation *)0x0) {
    eVar1 = internal::dom_parser_implementation::allocate(this_00,capacity,max_depth);
    return eVar1;
  }
  eVar1 = (**(code **)(*active_implementation + 0x18))();
  return eVar1;
}

Assistant:

simdjson_warn_unused
inline error_code parser::allocate(size_t capacity, size_t max_depth) noexcept {
  //
  // Reallocate implementation if needed
  //
  error_code err;
  if (implementation) {
    err = implementation->allocate(capacity, max_depth);
  } else {
    err = simdjson::active_implementation->create_dom_parser_implementation(capacity, max_depth, implementation);
  }
  if (err) { return err; }
  return SUCCESS;
}